

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators.hpp
# Opt level: O2

const_varint_iterator<long> __thiscall
protozero::const_varint_iterator<long>::operator++(const_varint_iterator<long> *this,int param_1)

{
  char *pcVar1;
  char *pcVar2;
  assert_error *this_00;
  undefined4 in_register_00000034;
  const_varint_iterator<long> cVar3;
  
  pcVar1 = this->m_data;
  if (pcVar1 != (char *)0x0) {
    pcVar2 = this->m_end;
    operator++(this);
    cVar3.m_end = pcVar2;
    cVar3.m_data = pcVar1;
    return cVar3;
  }
  this_00 = (assert_error *)__cxa_allocate_exception(0x10,CONCAT44(in_register_00000034,param_1));
  assert_error::assert_error(this_00,"m_data");
  __cxa_throw(this_00,&assert_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const_varint_iterator operator++(int) {
        protozero_assert(m_data);
        const const_varint_iterator tmp{*this};
        ++(*this);
        return tmp;
    }